

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O0

void crash_catcher(int signum,siginfo_t *siginfo,void *context)

{
  __uid_t _Var1;
  __uid_t _Var2;
  int iVar3;
  __pid_t _Var4;
  uint local_30;
  int local_2c;
  int status;
  int fd [2];
  pid_t dbg_pid;
  void *context_local;
  siginfo_t *siginfo_local;
  int signum_local;
  
  unique0x1000029a = context;
  _Var1 = getuid();
  _Var2 = geteuid();
  if (_Var1 == _Var2) {
    safe_write(2,"\n\n*** Fatal Error ***\n",0x16);
    iVar3 = pipe(&local_2c);
    if (iVar3 == -1) {
      safe_write(2,"!!! Failed to create pipe\n",0x1a);
      raise(signum);
    }
    else {
      crash_info.signum = signum;
      crash_info.pid = getpid();
      crash_info.has_siginfo = (int)(siginfo != (siginfo_t *)0x0);
      if (siginfo != (siginfo_t *)0x0) {
        memcpy(&crash_info.siginfo,siginfo,0x80);
      }
      if (cc_user_info != (_func_int_char_ptr_char_ptr *)0x0) {
        (*cc_user_info)(crash_info.buf,(char *)&Video);
      }
      fd[0] = fork();
      if (fd[0] == 0xffffffff) {
        safe_write(2,"!!! Failed to fork debug process\n",0x21);
        raise(signum);
      }
      else {
        if (fd[0] == 0) {
          dup2(local_2c,0);
          close(local_2c);
          close(status);
          execl(argv0,argv0,"--cc-handle-crash",0);
          safe_write(2,"!!! Failed to exec debug process\n",0x21);
          _exit(1);
        }
        prctl(0x59616d61,(ulong)(uint)fd[0],0,0);
        safe_write(status,&crash_info,0x1090);
        close(local_2c);
        close(status);
        do {
          do {
            _Var4 = waitpid(fd[0],(int *)&local_30,0);
          } while (_Var4 != fd[0]);
        } while (((local_30 & 0x7f) != 0) && ((char)(((byte)local_30 & 0x7f) + 1) >> 1 < '\x01'));
        raise(signum);
      }
    }
  }
  else {
    raise(signum);
  }
  return;
}

Assistant:

static void crash_catcher(int signum, siginfo_t *siginfo, void *context)
{
	//ucontext_t *ucontext = (ucontext_t*)context;
	pid_t dbg_pid;
	int fd[2];

	/* Make sure the effective uid is the real uid */
	if(getuid() != geteuid())
	{
		raise(signum);
		return;
	}

	safe_write(STDERR_FILENO, fatal_err, sizeof(fatal_err)-1);
	if(pipe(fd) == -1)
	{
		safe_write(STDERR_FILENO, pipe_err, sizeof(pipe_err)-1);
		raise(signum);
		return;
	}

	crash_info.signum = signum;
	crash_info.pid = getpid();
	crash_info.has_siginfo = !!siginfo;
	if(siginfo)
		crash_info.siginfo = *siginfo;
	if(cc_user_info)
		cc_user_info(crash_info.buf, crash_info.buf+sizeof(crash_info.buf));

	/* Fork off to start a crash handler */
	switch((dbg_pid=fork()))
	{
		/* Error */
		case -1:
			safe_write(STDERR_FILENO, fork_err, sizeof(fork_err)-1);
			raise(signum);
			return;

		case 0:
			dup2(fd[0], STDIN_FILENO);
			close(fd[0]);
			close(fd[1]);

			execl(argv0, argv0, crash_switch, NULL);

			safe_write(STDERR_FILENO, exec_err, sizeof(exec_err)-1);
			_exit(1);

		default:
#ifdef __linux__
			prctl(PR_SET_PTRACER, dbg_pid, 0, 0, 0);
#endif
			safe_write(fd[1], &crash_info, sizeof(crash_info));
			close(fd[0]);
			close(fd[1]);

			/* Wait; we'll be killed when gdb is done */
			do {
				int status;
				if(waitpid(dbg_pid, &status, 0) == dbg_pid &&
				   (WIFEXITED(status) || WIFSIGNALED(status)))
				{
					/* The debug process died before it could kill us */
					raise(signum);
					break;
				}
			} while(1);
	}
}